

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

string * __thiscall cmake::StripExtension(string *__return_storage_ptr__,cmake *this,string *file)

{
  pointer pcVar1;
  bool bVar2;
  ulong uVar3;
  string_view ext;
  
  uVar3 = std::__cxx11::string::rfind((char)file,0x2e);
  if (uVar3 != 0xffffffffffffffff) {
    if (file->_M_string_length <= uVar3) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
    }
    ext._M_str = (file->_M_dataplus)._M_p + uVar3 + 1;
    ext._M_len = file->_M_string_length - (uVar3 + 1);
    bVar2 = IsAKnownExtension(this,ext);
    if (bVar2) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)file);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + file->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::StripExtension(const std::string& file) const
{
  auto dotpos = file.rfind('.');
  if (dotpos != std::string::npos) {
#if defined(_WIN32) || defined(__APPLE__)
    auto ext = cmSystemTools::LowerCase(file.substr(dotpos + 1));
#else
    auto ext = cm::string_view(file).substr(dotpos + 1);
#endif
    if (this->IsAKnownExtension(ext)) {
      return file.substr(0, dotpos);
    }
  }
  return file;
}